

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageCracker.h
# Opt level: O0

void __thiscall
FIX44::MessageCracker::crack(MessageCracker *this,Message *message,SessionID *sessionID)

{
  bool bVar1;
  Header *this_00;
  string *__lhs;
  string *msgTypeValue;
  SessionID *sessionID_local;
  Message *message_local;
  MessageCracker *this_local;
  
  this_00 = FIX44::Message::getHeader(message);
  __lhs = FIX::FieldMap::getField_abi_cxx11_((FieldMap *)this_00,0x23);
  bVar1 = std::operator==(__lhs,"0");
  if (bVar1) {
    (*this->_vptr_MessageCracker[4])(this,message,sessionID);
  }
  else {
    bVar1 = std::operator==(__lhs,"1");
    if (bVar1) {
      (*this->_vptr_MessageCracker[5])(this,message,sessionID);
    }
    else {
      bVar1 = std::operator==(__lhs,"2");
      if (bVar1) {
        (*this->_vptr_MessageCracker[6])(this,message,sessionID);
      }
      else {
        bVar1 = std::operator==(__lhs,"3");
        if (bVar1) {
          (*this->_vptr_MessageCracker[7])(this,message,sessionID);
        }
        else {
          bVar1 = std::operator==(__lhs,"4");
          if (bVar1) {
            (*this->_vptr_MessageCracker[8])(this,message,sessionID);
          }
          else {
            bVar1 = std::operator==(__lhs,"5");
            if (bVar1) {
              (*this->_vptr_MessageCracker[9])(this,message,sessionID);
            }
            else {
              bVar1 = std::operator==(__lhs,"6");
              if (bVar1) {
                (*this->_vptr_MessageCracker[10])(this,message,sessionID);
              }
              else {
                bVar1 = std::operator==(__lhs,"7");
                if (bVar1) {
                  (*this->_vptr_MessageCracker[0xb])(this,message,sessionID);
                }
                else {
                  bVar1 = std::operator==(__lhs,"8");
                  if (bVar1) {
                    (*this->_vptr_MessageCracker[0xc])(this,message,sessionID);
                  }
                  else {
                    bVar1 = std::operator==(__lhs,"9");
                    if (bVar1) {
                      (*this->_vptr_MessageCracker[0xd])(this,message,sessionID);
                    }
                    else {
                      bVar1 = std::operator==(__lhs,"A");
                      if (bVar1) {
                        (*this->_vptr_MessageCracker[0xe])(this,message,sessionID);
                      }
                      else {
                        bVar1 = std::operator==(__lhs,"B");
                        if (bVar1) {
                          (*this->_vptr_MessageCracker[0xf])(this,message,sessionID);
                        }
                        else {
                          bVar1 = std::operator==(__lhs,"C");
                          if (bVar1) {
                            (*this->_vptr_MessageCracker[0x10])(this,message,sessionID);
                          }
                          else {
                            bVar1 = std::operator==(__lhs,"D");
                            if (bVar1) {
                              (*this->_vptr_MessageCracker[0x11])(this,message,sessionID);
                            }
                            else {
                              bVar1 = std::operator==(__lhs,"E");
                              if (bVar1) {
                                (*this->_vptr_MessageCracker[0x12])(this,message,sessionID);
                              }
                              else {
                                bVar1 = std::operator==(__lhs,"F");
                                if (bVar1) {
                                  (*this->_vptr_MessageCracker[0x13])(this,message,sessionID);
                                }
                                else {
                                  bVar1 = std::operator==(__lhs,"G");
                                  if (bVar1) {
                                    (*this->_vptr_MessageCracker[0x14])(this,message,sessionID);
                                  }
                                  else {
                                    bVar1 = std::operator==(__lhs,"H");
                                    if (bVar1) {
                                      (*this->_vptr_MessageCracker[0x15])(this,message,sessionID);
                                    }
                                    else {
                                      bVar1 = std::operator==(__lhs,"J");
                                      if (bVar1) {
                                        (*this->_vptr_MessageCracker[0x16])(this,message,sessionID);
                                      }
                                      else {
                                        bVar1 = std::operator==(__lhs,"K");
                                        if (bVar1) {
                                          (*this->_vptr_MessageCracker[0x17])
                                                    (this,message,sessionID);
                                        }
                                        else {
                                          bVar1 = std::operator==(__lhs,"L");
                                          if (bVar1) {
                                            (*this->_vptr_MessageCracker[0x18])
                                                      (this,message,sessionID);
                                          }
                                          else {
                                            bVar1 = std::operator==(__lhs,"M");
                                            if (bVar1) {
                                              (*this->_vptr_MessageCracker[0x19])
                                                        (this,message,sessionID);
                                            }
                                            else {
                                              bVar1 = std::operator==(__lhs,"N");
                                              if (bVar1) {
                                                (*this->_vptr_MessageCracker[0x1a])
                                                          (this,message,sessionID);
                                              }
                                              else {
                                                bVar1 = std::operator==(__lhs,"P");
                                                if (bVar1) {
                                                  (*this->_vptr_MessageCracker[0x1b])
                                                            (this,message,sessionID);
                                                }
                                                else {
                                                  bVar1 = std::operator==(__lhs,"Q");
                                                  if (bVar1) {
                                                    (*this->_vptr_MessageCracker[0x1c])
                                                              (this,message,sessionID);
                                                  }
                                                  else {
                                                    bVar1 = std::operator==(__lhs,"R");
                                                    if (bVar1) {
                                                      (*this->_vptr_MessageCracker[0x1d])
                                                                (this,message,sessionID);
                                                    }
                                                    else {
                                                      bVar1 = std::operator==(__lhs,"S");
                                                      if (bVar1) {
                                                        (*this->_vptr_MessageCracker[0x1e])
                                                                  (this,message,sessionID);
                                                      }
                                                      else {
                                                        bVar1 = std::operator==(__lhs,"T");
                                                        if (bVar1) {
                                                          (*this->_vptr_MessageCracker[0x1f])
                                                                    (this,message,sessionID);
                                                        }
                                                        else {
                                                          bVar1 = std::operator==(__lhs,"V");
                                                          if (bVar1) {
                                                            (*this->_vptr_MessageCracker[0x20])
                                                                      (this,message,sessionID);
                                                          }
                                                          else {
                                                            bVar1 = std::operator==(__lhs,"W");
                                                            if (bVar1) {
                                                              (*this->_vptr_MessageCracker[0x21])
                                                                        (this,message,sessionID);
                                                            }
                                                            else {
                                                              bVar1 = std::operator==(__lhs,"X");
                                                              if (bVar1) {
                                                                (*this->_vptr_MessageCracker[0x22])
                                                                          (this,message,sessionID);
                                                              }
                                                              else {
                                                                bVar1 = std::operator==(__lhs,"Y");
                                                                if (bVar1) {
                                                                  (*this->_vptr_MessageCracker[0x23]
                                                                  )(this,message,sessionID);
                                                                }
                                                                else {
                                                                  bVar1 = std::operator==(__lhs,"Z")
                                                                  ;
                                                                  if (bVar1) {
                                                                    (*this->_vptr_MessageCracker
                                                                      [0x24])(this,message,sessionID
                                                                             );
                                                                  }
                                                                  else {
                                                                    bVar1 = std::operator==(__lhs,
                                                  "a");
                                                  if (bVar1) {
                                                    (*this->_vptr_MessageCracker[0x25])
                                                              (this,message,sessionID);
                                                  }
                                                  else {
                                                    bVar1 = std::operator==(__lhs,"b");
                                                    if (bVar1) {
                                                      (*this->_vptr_MessageCracker[0x26])
                                                                (this,message,sessionID);
                                                    }
                                                    else {
                                                      bVar1 = std::operator==(__lhs,"c");
                                                      if (bVar1) {
                                                        (*this->_vptr_MessageCracker[0x27])
                                                                  (this,message,sessionID);
                                                      }
                                                      else {
                                                        bVar1 = std::operator==(__lhs,"d");
                                                        if (bVar1) {
                                                          (*this->_vptr_MessageCracker[0x28])
                                                                    (this,message,sessionID);
                                                        }
                                                        else {
                                                          bVar1 = std::operator==(__lhs,"e");
                                                          if (bVar1) {
                                                            (*this->_vptr_MessageCracker[0x29])
                                                                      (this,message,sessionID);
                                                          }
                                                          else {
                                                            bVar1 = std::operator==(__lhs,"f");
                                                            if (bVar1) {
                                                              (*this->_vptr_MessageCracker[0x2a])
                                                                        (this,message,sessionID);
                                                            }
                                                            else {
                                                              bVar1 = std::operator==(__lhs,"g");
                                                              if (bVar1) {
                                                                (*this->_vptr_MessageCracker[0x2b])
                                                                          (this,message,sessionID);
                                                              }
                                                              else {
                                                                bVar1 = std::operator==(__lhs,"h");
                                                                if (bVar1) {
                                                                  (*this->_vptr_MessageCracker[0x2c]
                                                                  )(this,message,sessionID);
                                                                }
                                                                else {
                                                                  bVar1 = std::operator==(__lhs,"i")
                                                                  ;
                                                                  if (bVar1) {
                                                                    (*this->_vptr_MessageCracker
                                                                      [0x2d])(this,message,sessionID
                                                                             );
                                                                  }
                                                                  else {
                                                                    bVar1 = std::operator==(__lhs,
                                                  "j");
                                                  if (bVar1) {
                                                    (*this->_vptr_MessageCracker[0x2e])
                                                              (this,message,sessionID);
                                                  }
                                                  else {
                                                    bVar1 = std::operator==(__lhs,"k");
                                                    if (bVar1) {
                                                      (*this->_vptr_MessageCracker[0x2f])
                                                                (this,message,sessionID);
                                                    }
                                                    else {
                                                      bVar1 = std::operator==(__lhs,"l");
                                                      if (bVar1) {
                                                        (*this->_vptr_MessageCracker[0x30])
                                                                  (this,message,sessionID);
                                                      }
                                                      else {
                                                        bVar1 = std::operator==(__lhs,"m");
                                                        if (bVar1) {
                                                          (*this->_vptr_MessageCracker[0x31])
                                                                    (this,message,sessionID);
                                                        }
                                                        else {
                                                          bVar1 = std::operator==(__lhs,"n");
                                                          if (bVar1) {
                                                            (*this->_vptr_MessageCracker[0x32])
                                                                      (this,message,sessionID);
                                                          }
                                                          else {
                                                            bVar1 = std::operator==(__lhs,"o");
                                                            if (bVar1) {
                                                              (*this->_vptr_MessageCracker[0x33])
                                                                        (this,message,sessionID);
                                                            }
                                                            else {
                                                              bVar1 = std::operator==(__lhs,"p");
                                                              if (bVar1) {
                                                                (*this->_vptr_MessageCracker[0x34])
                                                                          (this,message,sessionID);
                                                              }
                                                              else {
                                                                bVar1 = std::operator==(__lhs,"q");
                                                                if (bVar1) {
                                                                  (*this->_vptr_MessageCracker[0x35]
                                                                  )(this,message,sessionID);
                                                                }
                                                                else {
                                                                  bVar1 = std::operator==(__lhs,"r")
                                                                  ;
                                                                  if (bVar1) {
                                                                    (*this->_vptr_MessageCracker
                                                                      [0x36])(this,message,sessionID
                                                                             );
                                                                  }
                                                                  else {
                                                                    bVar1 = std::operator==(__lhs,
                                                  "s");
                                                  if (bVar1) {
                                                    (*this->_vptr_MessageCracker[0x37])
                                                              (this,message,sessionID);
                                                  }
                                                  else {
                                                    bVar1 = std::operator==(__lhs,"t");
                                                    if (bVar1) {
                                                      (*this->_vptr_MessageCracker[0x38])
                                                                (this,message,sessionID);
                                                    }
                                                    else {
                                                      bVar1 = std::operator==(__lhs,"u");
                                                      if (bVar1) {
                                                        (*this->_vptr_MessageCracker[0x39])
                                                                  (this,message,sessionID);
                                                      }
                                                      else {
                                                        bVar1 = std::operator==(__lhs,"v");
                                                        if (bVar1) {
                                                          (*this->_vptr_MessageCracker[0x3a])
                                                                    (this,message,sessionID);
                                                        }
                                                        else {
                                                          bVar1 = std::operator==(__lhs,"w");
                                                          if (bVar1) {
                                                            (*this->_vptr_MessageCracker[0x3b])
                                                                      (this,message,sessionID);
                                                          }
                                                          else {
                                                            bVar1 = std::operator==(__lhs,"x");
                                                            if (bVar1) {
                                                              (*this->_vptr_MessageCracker[0x3c])
                                                                        (this,message,sessionID);
                                                            }
                                                            else {
                                                              bVar1 = std::operator==(__lhs,"y");
                                                              if (bVar1) {
                                                                (*this->_vptr_MessageCracker[0x3d])
                                                                          (this,message,sessionID);
                                                              }
                                                              else {
                                                                bVar1 = std::operator==(__lhs,"z");
                                                                if (bVar1) {
                                                                  (*this->_vptr_MessageCracker[0x3e]
                                                                  )(this,message,sessionID);
                                                                }
                                                                else {
                                                                  bVar1 = std::operator==(__lhs,"AA"
                                                                                         );
                                                                  if (bVar1) {
                                                                    (*this->_vptr_MessageCracker
                                                                      [0x3f])(this,message,sessionID
                                                                             );
                                                                  }
                                                                  else {
                                                                    bVar1 = std::operator==(__lhs,
                                                  "AB");
                                                  if (bVar1) {
                                                    (*this->_vptr_MessageCracker[0x40])
                                                              (this,message,sessionID);
                                                  }
                                                  else {
                                                    bVar1 = std::operator==(__lhs,"AC");
                                                    if (bVar1) {
                                                      (*this->_vptr_MessageCracker[0x41])
                                                                (this,message,sessionID);
                                                    }
                                                    else {
                                                      bVar1 = std::operator==(__lhs,"AD");
                                                      if (bVar1) {
                                                        (*this->_vptr_MessageCracker[0x42])
                                                                  (this,message,sessionID);
                                                      }
                                                      else {
                                                        bVar1 = std::operator==(__lhs,"AE");
                                                        if (bVar1) {
                                                          (*this->_vptr_MessageCracker[0x43])
                                                                    (this,message,sessionID);
                                                        }
                                                        else {
                                                          bVar1 = std::operator==(__lhs,"AF");
                                                          if (bVar1) {
                                                            (*this->_vptr_MessageCracker[0x44])
                                                                      (this,message,sessionID);
                                                          }
                                                          else {
                                                            bVar1 = std::operator==(__lhs,"AG");
                                                            if (bVar1) {
                                                              (*this->_vptr_MessageCracker[0x45])
                                                                        (this,message,sessionID);
                                                            }
                                                            else {
                                                              bVar1 = std::operator==(__lhs,"AH");
                                                              if (bVar1) {
                                                                (*this->_vptr_MessageCracker[0x46])
                                                                          (this,message,sessionID);
                                                              }
                                                              else {
                                                                bVar1 = std::operator==(__lhs,"AI");
                                                                if (bVar1) {
                                                                  (*this->_vptr_MessageCracker[0x47]
                                                                  )(this,message,sessionID);
                                                                }
                                                                else {
                                                                  bVar1 = std::operator==(__lhs,"AJ"
                                                                                         );
                                                                  if (bVar1) {
                                                                    (*this->_vptr_MessageCracker
                                                                      [0x48])(this,message,sessionID
                                                                             );
                                                                  }
                                                                  else {
                                                                    bVar1 = std::operator==(__lhs,
                                                  "AK");
                                                  if (bVar1) {
                                                    (*this->_vptr_MessageCracker[0x49])
                                                              (this,message,sessionID);
                                                  }
                                                  else {
                                                    bVar1 = std::operator==(__lhs,"AL");
                                                    if (bVar1) {
                                                      (*this->_vptr_MessageCracker[0x4a])
                                                                (this,message,sessionID);
                                                    }
                                                    else {
                                                      bVar1 = std::operator==(__lhs,"AM");
                                                      if (bVar1) {
                                                        (*this->_vptr_MessageCracker[0x4b])
                                                                  (this,message,sessionID);
                                                      }
                                                      else {
                                                        bVar1 = std::operator==(__lhs,"AN");
                                                        if (bVar1) {
                                                          (*this->_vptr_MessageCracker[0x4c])
                                                                    (this,message,sessionID);
                                                        }
                                                        else {
                                                          bVar1 = std::operator==(__lhs,"AO");
                                                          if (bVar1) {
                                                            (*this->_vptr_MessageCracker[0x4d])
                                                                      (this,message,sessionID);
                                                          }
                                                          else {
                                                            bVar1 = std::operator==(__lhs,"AP");
                                                            if (bVar1) {
                                                              (*this->_vptr_MessageCracker[0x4e])
                                                                        (this,message,sessionID);
                                                            }
                                                            else {
                                                              bVar1 = std::operator==(__lhs,"AQ");
                                                              if (bVar1) {
                                                                (*this->_vptr_MessageCracker[0x4f])
                                                                          (this,message,sessionID);
                                                              }
                                                              else {
                                                                bVar1 = std::operator==(__lhs,"AR");
                                                                if (bVar1) {
                                                                  (*this->_vptr_MessageCracker[0x50]
                                                                  )(this,message,sessionID);
                                                                }
                                                                else {
                                                                  bVar1 = std::operator==(__lhs,"AS"
                                                                                         );
                                                                  if (bVar1) {
                                                                    (*this->_vptr_MessageCracker
                                                                      [0x51])(this,message,sessionID
                                                                             );
                                                                  }
                                                                  else {
                                                                    bVar1 = std::operator==(__lhs,
                                                  "AT");
                                                  if (bVar1) {
                                                    (*this->_vptr_MessageCracker[0x52])
                                                              (this,message,sessionID);
                                                  }
                                                  else {
                                                    bVar1 = std::operator==(__lhs,"AU");
                                                    if (bVar1) {
                                                      (*this->_vptr_MessageCracker[0x53])
                                                                (this,message,sessionID);
                                                    }
                                                    else {
                                                      bVar1 = std::operator==(__lhs,"AV");
                                                      if (bVar1) {
                                                        (*this->_vptr_MessageCracker[0x54])
                                                                  (this,message,sessionID);
                                                      }
                                                      else {
                                                        bVar1 = std::operator==(__lhs,"AW");
                                                        if (bVar1) {
                                                          (*this->_vptr_MessageCracker[0x55])
                                                                    (this,message,sessionID);
                                                        }
                                                        else {
                                                          bVar1 = std::operator==(__lhs,"AX");
                                                          if (bVar1) {
                                                            (*this->_vptr_MessageCracker[0x56])
                                                                      (this,message,sessionID);
                                                          }
                                                          else {
                                                            bVar1 = std::operator==(__lhs,"AY");
                                                            if (bVar1) {
                                                              (*this->_vptr_MessageCracker[0x57])
                                                                        (this,message,sessionID);
                                                            }
                                                            else {
                                                              bVar1 = std::operator==(__lhs,"AZ");
                                                              if (bVar1) {
                                                                (*this->_vptr_MessageCracker[0x58])
                                                                          (this,message,sessionID);
                                                              }
                                                              else {
                                                                bVar1 = std::operator==(__lhs,"BA");
                                                                if (bVar1) {
                                                                  (*this->_vptr_MessageCracker[0x59]
                                                                  )(this,message,sessionID);
                                                                }
                                                                else {
                                                                  bVar1 = std::operator==(__lhs,"BB"
                                                                                         );
                                                                  if (bVar1) {
                                                                    (*this->_vptr_MessageCracker
                                                                      [0x5a])(this,message,sessionID
                                                                             );
                                                                  }
                                                                  else {
                                                                    bVar1 = std::operator==(__lhs,
                                                  "BC");
                                                  if (bVar1) {
                                                    (*this->_vptr_MessageCracker[0x5b])
                                                              (this,message,sessionID);
                                                  }
                                                  else {
                                                    bVar1 = std::operator==(__lhs,"BD");
                                                    if (bVar1) {
                                                      (*this->_vptr_MessageCracker[0x5c])
                                                                (this,message,sessionID);
                                                    }
                                                    else {
                                                      bVar1 = std::operator==(__lhs,"BE");
                                                      if (bVar1) {
                                                        (*this->_vptr_MessageCracker[0x5d])
                                                                  (this,message,sessionID);
                                                      }
                                                      else {
                                                        bVar1 = std::operator==(__lhs,"BF");
                                                        if (bVar1) {
                                                          (*this->_vptr_MessageCracker[0x5e])
                                                                    (this,message,sessionID);
                                                        }
                                                        else {
                                                          bVar1 = std::operator==(__lhs,"BG");
                                                          if (bVar1) {
                                                            (*this->_vptr_MessageCracker[0x5f])
                                                                      (this,message,sessionID);
                                                          }
                                                          else {
                                                            bVar1 = std::operator==(__lhs,"BH");
                                                            if (bVar1) {
                                                              (*this->_vptr_MessageCracker[0x60])
                                                                        (this,message,sessionID);
                                                            }
                                                            else {
                                                              (*this->_vptr_MessageCracker[2])
                                                                        (this,message,sessionID);
                                                            }
                                                          }
                                                        }
                                                      }
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void crack( const Message& message, 
              const FIX::SessionID& sessionID )
  {
    const std::string & msgTypeValue 
      = message.getHeader().getField( FIX::FIELD::MsgType );
    
    
    if( msgTypeValue == "0" )
      return onMessage( (const Heartbeat&)message, sessionID );
    
    if( msgTypeValue == "1" )
      return onMessage( (const TestRequest&)message, sessionID );
    
    if( msgTypeValue == "2" )
      return onMessage( (const ResendRequest&)message, sessionID );
    
    if( msgTypeValue == "3" )
      return onMessage( (const Reject&)message, sessionID );
    
    if( msgTypeValue == "4" )
      return onMessage( (const SequenceReset&)message, sessionID );
    
    if( msgTypeValue == "5" )
      return onMessage( (const Logout&)message, sessionID );
    
    if( msgTypeValue == "6" )
      return onMessage( (const IOI&)message, sessionID );
    
    if( msgTypeValue == "7" )
      return onMessage( (const Advertisement&)message, sessionID );
    
    if( msgTypeValue == "8" )
      return onMessage( (const ExecutionReport&)message, sessionID );
    
    if( msgTypeValue == "9" )
      return onMessage( (const OrderCancelReject&)message, sessionID );
    
    if( msgTypeValue == "A" )
      return onMessage( (const Logon&)message, sessionID );
    
    if( msgTypeValue == "B" )
      return onMessage( (const News&)message, sessionID );
    
    if( msgTypeValue == "C" )
      return onMessage( (const Email&)message, sessionID );
    
    if( msgTypeValue == "D" )
      return onMessage( (const NewOrderSingle&)message, sessionID );
    
    if( msgTypeValue == "E" )
      return onMessage( (const NewOrderList&)message, sessionID );
    
    if( msgTypeValue == "F" )
      return onMessage( (const OrderCancelRequest&)message, sessionID );
    
    if( msgTypeValue == "G" )
      return onMessage( (const OrderCancelReplaceRequest&)message, sessionID );
    
    if( msgTypeValue == "H" )
      return onMessage( (const OrderStatusRequest&)message, sessionID );
    
    if( msgTypeValue == "J" )
      return onMessage( (const AllocationInstruction&)message, sessionID );
    
    if( msgTypeValue == "K" )
      return onMessage( (const ListCancelRequest&)message, sessionID );
    
    if( msgTypeValue == "L" )
      return onMessage( (const ListExecute&)message, sessionID );
    
    if( msgTypeValue == "M" )
      return onMessage( (const ListStatusRequest&)message, sessionID );
    
    if( msgTypeValue == "N" )
      return onMessage( (const ListStatus&)message, sessionID );
    
    if( msgTypeValue == "P" )
      return onMessage( (const AllocationInstructionAck&)message, sessionID );
    
    if( msgTypeValue == "Q" )
      return onMessage( (const DontKnowTrade&)message, sessionID );
    
    if( msgTypeValue == "R" )
      return onMessage( (const QuoteRequest&)message, sessionID );
    
    if( msgTypeValue == "S" )
      return onMessage( (const Quote&)message, sessionID );
    
    if( msgTypeValue == "T" )
      return onMessage( (const SettlementInstructions&)message, sessionID );
    
    if( msgTypeValue == "V" )
      return onMessage( (const MarketDataRequest&)message, sessionID );
    
    if( msgTypeValue == "W" )
      return onMessage( (const MarketDataSnapshotFullRefresh&)message, sessionID );
    
    if( msgTypeValue == "X" )
      return onMessage( (const MarketDataIncrementalRefresh&)message, sessionID );
    
    if( msgTypeValue == "Y" )
      return onMessage( (const MarketDataRequestReject&)message, sessionID );
    
    if( msgTypeValue == "Z" )
      return onMessage( (const QuoteCancel&)message, sessionID );
    
    if( msgTypeValue == "a" )
      return onMessage( (const QuoteStatusRequest&)message, sessionID );
    
    if( msgTypeValue == "b" )
      return onMessage( (const MassQuoteAcknowledgement&)message, sessionID );
    
    if( msgTypeValue == "c" )
      return onMessage( (const SecurityDefinitionRequest&)message, sessionID );
    
    if( msgTypeValue == "d" )
      return onMessage( (const SecurityDefinition&)message, sessionID );
    
    if( msgTypeValue == "e" )
      return onMessage( (const SecurityStatusRequest&)message, sessionID );
    
    if( msgTypeValue == "f" )
      return onMessage( (const SecurityStatus&)message, sessionID );
    
    if( msgTypeValue == "g" )
      return onMessage( (const TradingSessionStatusRequest&)message, sessionID );
    
    if( msgTypeValue == "h" )
      return onMessage( (const TradingSessionStatus&)message, sessionID );
    
    if( msgTypeValue == "i" )
      return onMessage( (const MassQuote&)message, sessionID );
    
    if( msgTypeValue == "j" )
      return onMessage( (const BusinessMessageReject&)message, sessionID );
    
    if( msgTypeValue == "k" )
      return onMessage( (const BidRequest&)message, sessionID );
    
    if( msgTypeValue == "l" )
      return onMessage( (const BidResponse&)message, sessionID );
    
    if( msgTypeValue == "m" )
      return onMessage( (const ListStrikePrice&)message, sessionID );
    
    if( msgTypeValue == "n" )
      return onMessage( (const XMLnonFIX&)message, sessionID );
    
    if( msgTypeValue == "o" )
      return onMessage( (const RegistrationInstructions&)message, sessionID );
    
    if( msgTypeValue == "p" )
      return onMessage( (const RegistrationInstructionsResponse&)message, sessionID );
    
    if( msgTypeValue == "q" )
      return onMessage( (const OrderMassCancelRequest&)message, sessionID );
    
    if( msgTypeValue == "r" )
      return onMessage( (const OrderMassCancelReport&)message, sessionID );
    
    if( msgTypeValue == "s" )
      return onMessage( (const NewOrderCross&)message, sessionID );
    
    if( msgTypeValue == "t" )
      return onMessage( (const CrossOrderCancelReplaceRequest&)message, sessionID );
    
    if( msgTypeValue == "u" )
      return onMessage( (const CrossOrderCancelRequest&)message, sessionID );
    
    if( msgTypeValue == "v" )
      return onMessage( (const SecurityTypeRequest&)message, sessionID );
    
    if( msgTypeValue == "w" )
      return onMessage( (const SecurityTypes&)message, sessionID );
    
    if( msgTypeValue == "x" )
      return onMessage( (const SecurityListRequest&)message, sessionID );
    
    if( msgTypeValue == "y" )
      return onMessage( (const SecurityList&)message, sessionID );
    
    if( msgTypeValue == "z" )
      return onMessage( (const DerivativeSecurityListRequest&)message, sessionID );
    
    if( msgTypeValue == "AA" )
      return onMessage( (const DerivativeSecurityList&)message, sessionID );
    
    if( msgTypeValue == "AB" )
      return onMessage( (const NewOrderMultileg&)message, sessionID );
    
    if( msgTypeValue == "AC" )
      return onMessage( (const MultilegOrderCancelReplace&)message, sessionID );
    
    if( msgTypeValue == "AD" )
      return onMessage( (const TradeCaptureReportRequest&)message, sessionID );
    
    if( msgTypeValue == "AE" )
      return onMessage( (const TradeCaptureReport&)message, sessionID );
    
    if( msgTypeValue == "AF" )
      return onMessage( (const OrderMassStatusRequest&)message, sessionID );
    
    if( msgTypeValue == "AG" )
      return onMessage( (const QuoteRequestReject&)message, sessionID );
    
    if( msgTypeValue == "AH" )
      return onMessage( (const RFQRequest&)message, sessionID );
    
    if( msgTypeValue == "AI" )
      return onMessage( (const QuoteStatusReport&)message, sessionID );
    
    if( msgTypeValue == "AJ" )
      return onMessage( (const QuoteResponse&)message, sessionID );
    
    if( msgTypeValue == "AK" )
      return onMessage( (const Confirmation&)message, sessionID );
    
    if( msgTypeValue == "AL" )
      return onMessage( (const PositionMaintenanceRequest&)message, sessionID );
    
    if( msgTypeValue == "AM" )
      return onMessage( (const PositionMaintenanceReport&)message, sessionID );
    
    if( msgTypeValue == "AN" )
      return onMessage( (const RequestForPositions&)message, sessionID );
    
    if( msgTypeValue == "AO" )
      return onMessage( (const RequestForPositionsAck&)message, sessionID );
    
    if( msgTypeValue == "AP" )
      return onMessage( (const PositionReport&)message, sessionID );
    
    if( msgTypeValue == "AQ" )
      return onMessage( (const TradeCaptureReportRequestAck&)message, sessionID );
    
    if( msgTypeValue == "AR" )
      return onMessage( (const TradeCaptureReportAck&)message, sessionID );
    
    if( msgTypeValue == "AS" )
      return onMessage( (const AllocationReport&)message, sessionID );
    
    if( msgTypeValue == "AT" )
      return onMessage( (const AllocationReportAck&)message, sessionID );
    
    if( msgTypeValue == "AU" )
      return onMessage( (const ConfirmationAck&)message, sessionID );
    
    if( msgTypeValue == "AV" )
      return onMessage( (const SettlementInstructionRequest&)message, sessionID );
    
    if( msgTypeValue == "AW" )
      return onMessage( (const AssignmentReport&)message, sessionID );
    
    if( msgTypeValue == "AX" )
      return onMessage( (const CollateralRequest&)message, sessionID );
    
    if( msgTypeValue == "AY" )
      return onMessage( (const CollateralAssignment&)message, sessionID );
    
    if( msgTypeValue == "AZ" )
      return onMessage( (const CollateralResponse&)message, sessionID );
    
    if( msgTypeValue == "BA" )
      return onMessage( (const CollateralReport&)message, sessionID );
    
    if( msgTypeValue == "BB" )
      return onMessage( (const CollateralInquiry&)message, sessionID );
    
    if( msgTypeValue == "BC" )
      return onMessage( (const NetworkCounterpartySystemStatusRequest&)message, sessionID );
    
    if( msgTypeValue == "BD" )
      return onMessage( (const NetworkCounterpartySystemStatusResponse&)message, sessionID );
    
    if( msgTypeValue == "BE" )
      return onMessage( (const UserRequest&)message, sessionID );
    
    if( msgTypeValue == "BF" )
      return onMessage( (const UserResponse&)message, sessionID );
    
    if( msgTypeValue == "BG" )
      return onMessage( (const CollateralInquiryAck&)message, sessionID );
    
    if( msgTypeValue == "BH" )
      return onMessage( (const ConfirmationRequest&)message, sessionID );
    
    return onMessage( message, sessionID );
  }